

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

void __thiscall
VectorWriter::
VectorWriter<ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>>>
          (VectorWriter *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchDataIn,
          size_t nPosIn,
          ParamsWrapper<CAddress::SerParams,_std::vector<CAddress,_std::allocator<CAddress>_>_>
          *args)

{
  long lVar1;
  size_t in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  VectorWriter *in_RSI;
  long in_FS_OFFSET;
  VectorWriter *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  VectorWriter(in_RSI,in_RDX,in_RCX);
  SerializeMany<VectorWriter,ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>>>
            (in_stack_ffffffffffffffc8,
             (ParamsWrapper<CAddress::SerParams,_std::vector<CAddress,_std::allocator<CAddress>_>_>
              *)0x364722);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VectorWriter(std::vector<unsigned char>& vchDataIn, size_t nPosIn, Args&&... args) : VectorWriter{vchDataIn, nPosIn}
    {
        ::SerializeMany(*this, std::forward<Args>(args)...);
    }